

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall TileWire::updateWire(TileWire *this,State state)

{
  undefined4 in_ESI;
  long *in_RDI;
  int j;
  bool *exitDirections;
  int i;
  int local_1c;
  int local_10;
  
  if (*(int *)((long)in_RDI + 0x164) == 4) {
    if (*(uint *)(in_RDI + 0x2e) != Tile::currentUpdateTime) {
      (**(code **)(*in_RDI + 0x48))(in_RDI,0,in_ESI);
    }
    if (*(uint *)((long)in_RDI + 0x174) != Tile::currentUpdateTime) {
      (**(code **)(*in_RDI + 0x48))(in_RDI,1,in_ESI);
    }
  }
  else {
    for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        if ((*(byte *)((long)in_RDI +
                      (long)local_1c +
                      (long)local_10 * 4 +
                      (long)*(int *)((long)in_RDI + 0x164) * 0x10 +
                      (long)(int)in_RDI[1] * 0x50 + 0x21) & 1) == 1) {
          (**(code **)(*in_RDI + 0x48))(in_RDI,local_10,in_ESI);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void TileWire::updateWire(State state) {
    if (_type == CROSSOVER) {
        if (_updateTimestamp1 != Tile::currentUpdateTime) {    // For crossover, check both paths for update time mismatch.
            followWire(NORTH, state);
        }
        if (_updateTimestamp2 != Tile::currentUpdateTime) {
            followWire(EAST, state);
        }
    } else {
        for (int i = 0; i < 4; ++i) {    // Check combinations of entry and exit directions through this wire until one works out.
            const bool* exitDirections = CONNECTION_INFO[_direction][_type][i];
            for (int j = 0; j < 4; ++j) {
                if (exitDirections[j] == true) {
                    followWire(static_cast<Direction>(i), state);
                    return;
                }
            }
        }
    }
}